

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ITracker * __thiscall Catch::TestCaseTracking::TrackerContext::startRun(TrackerContext *this)

{
  SectionTracker *this_00;
  string local_48;
  allocator local_21;
  
  this_00 = (SectionTracker *)operator_new(0x60);
  std::__cxx11::string::string((string *)&local_48,"{root}",&local_21);
  SectionTracker::SectionTracker(this_00,&local_48,this,(ITracker *)0x0);
  Ptr<Catch::TestCaseTracking::ITracker>::operator=(&this->m_rootTracker,(ITracker *)this_00);
  std::__cxx11::string::~string((string *)&local_48);
  this->m_currentTracker = (ITracker *)0x0;
  this->m_runState = Executing;
  return (this->m_rootTracker).m_p;
}

Assistant:

inline ITracker& TrackerContext::startRun() {
        m_rootTracker = new SectionTracker( "{root}", *this, CATCH_NULL );
        m_currentTracker = CATCH_NULL;
        m_runState = Executing;
        return *m_rootTracker;
    }